

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

future<void> * __thiscall
mxx::comm::isend<int>
          (future<void> *__return_storage_ptr__,comm *this,int *msg,size_t size,int dest,int tag)

{
  MPI_Comm poVar1;
  int iVar2;
  MPI_Datatype poVar3;
  MPI_Request *ppoVar4;
  datatype local_c0;
  undefined1 local_a8 [8];
  datatype dt_1;
  undefined1 local_80 [8];
  datatype dt;
  future_builder<void> f;
  int tag_local;
  int dest_local;
  size_t size_local;
  int *msg_local;
  comm *this_local;
  
  if (-1 < dest) {
    iVar2 = comm::size(this);
    if (dest < iVar2) goto LAB_00151e16;
  }
  assert_fail("0 <= dest && dest < this->size()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
              ,0x151,"isend");
LAB_00151e16:
  future_builder<void>::future_builder((future_builder<void> *)&dt.builtin);
  if (size < 0x7fffffff) {
    get_datatype<int>();
    poVar3 = mxx::datatype::type((datatype *)local_80);
    poVar1 = this->mpi_comm;
    ppoVar4 = future_builder<void>::add_request((future_builder<void> *)&dt.builtin);
    MPI_Isend(msg,size & 0xffffffff,poVar3,dest,tag,poVar1,ppoVar4);
    mxx::datatype::~datatype((datatype *)local_80);
  }
  else {
    get_datatype<int>();
    mxx::datatype::contiguous((datatype *)local_a8,&local_c0,size);
    mxx::datatype::~datatype(&local_c0);
    poVar3 = mxx::datatype::type((datatype *)local_a8);
    poVar1 = this->mpi_comm;
    ppoVar4 = future_builder<void>::add_request((future_builder<void> *)&dt.builtin);
    MPI_Isend(msg,1,poVar3,dest,tag,poVar1,ppoVar4);
    mxx::datatype::~datatype((datatype *)local_a8);
  }
  future_builder<void>::get_future(__return_storage_ptr__,(future_builder<void> *)&dt.builtin);
  future_builder<void>::~future_builder((future_builder<void> *)&dt.builtin);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<void> isend(const T* msg, size_t size, int dest, int tag = 0) const {
        MXX_ASSERT(0 <= dest && dest < this->size());
        mxx::future_builder<void> f;
        if (size < mxx::max_int) {
            mxx::datatype dt = mxx::get_datatype<T>();
            MPI_Isend(const_cast<T*>(msg), size, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        } else {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
            MPI_Isend(const_cast<T*>(msg), 1, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        }
        return f.get_future();
    }